

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O2

void h2v1_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                  JSAMPARRAY *output_data_ptr)

{
  JSAMPLE JVar1;
  JSAMPARRAY ppJVar2;
  long lVar3;
  JSAMPLE *pJVar4;
  JSAMPROW pJVar5;
  JSAMPROW pJVar6;
  
  ppJVar2 = *output_data_ptr;
  for (lVar3 = 0; lVar3 < cinfo->max_v_samp_factor; lVar3 = lVar3 + 1) {
    pJVar4 = input_data[lVar3];
    pJVar5 = ppJVar2[lVar3];
    pJVar6 = pJVar5 + cinfo->output_width;
    for (; pJVar5 < pJVar6; pJVar5 = pJVar5 + 2) {
      JVar1 = *pJVar4;
      pJVar4 = pJVar4 + 1;
      *pJVar5 = JVar1;
      pJVar5[1] = JVar1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  JSAMPARRAY output_data = *output_data_ptr;
  register JSAMPROW inptr, outptr;
  register JSAMPLE invalue;
  JSAMPROW outend;
  int inrow;

  for (inrow = 0; inrow < cinfo->max_v_samp_factor; inrow++) {
    inptr = input_data[inrow];
    outptr = output_data[inrow];
    outend = outptr + cinfo->output_width;
    while (outptr < outend) {
      invalue = *inptr++;
      *outptr++ = invalue;
      *outptr++ = invalue;
    }
  }
}